

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O3

bool __thiscall
cmMessageCommand::InitialPass
          (cmMessageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *delimiter;
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  cmMessenger *this_00;
  MessageType t;
  pointer pbVar7;
  string message;
  string local_88;
  string local_68;
  pointer local_48;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar7) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_00212f25;
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)pbVar1);
    local_48 = pbVar7;
    if (iVar6 == 0) {
      t = FATAL_ERROR;
LAB_00212be1:
      local_40.Begin._M_current = pbVar1 + 1;
      bVar4 = false;
LAB_00212be4:
      bVar3 = false;
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)pbVar1);
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::string::compare((char *)pbVar1);
        if (iVar6 == 0) {
          t = WARNING;
          goto LAB_00212be1;
        }
        iVar6 = std::__cxx11::string::compare((char *)pbVar1);
        if (iVar6 == 0) {
          pcVar2 = (this->super_cmCommand).Makefile;
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
          bVar4 = cmMakefile::IsSet(pcVar2,&local_88);
          if (bVar4) {
            pcVar2 = (this->super_cmCommand).Makefile;
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
            bVar3 = cmMakefile::IsOn(pcVar2,&local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,
                              CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                       local_68.field_2._M_local_buf[0]) + 1);
            }
            bVar3 = !bVar3;
          }
          else {
            bVar3 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          t = AUTHOR_ERROR;
          if (bVar3 == false) {
            pcVar2 = (this->super_cmCommand).Makefile;
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
            bVar4 = cmMakefile::IsOn(pcVar2,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            t = AUTHOR_WARNING;
            if (bVar4) goto LAB_00212f25;
          }
          goto LAB_00212e39;
        }
        iVar6 = std::__cxx11::string::compare((char *)pbVar1);
        if (iVar6 == 0) {
          local_40.Begin._M_current = pbVar1 + 1;
          bVar4 = true;
          t = MESSAGE;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)pbVar1);
          if (iVar6 == 0) {
            pcVar2 = (this->super_cmCommand).Makefile;
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,"CMAKE_ERROR_DEPRECATED","");
            bVar3 = cmMakefile::IsOn(pcVar2,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            t = DEPRECATION_ERROR;
            if (!bVar3) {
              pcVar2 = (this->super_cmCommand).Makefile;
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_88,"CMAKE_WARN_DEPRECATED","");
              bVar4 = cmMakefile::IsSet(pcVar2,&local_88);
              bVar5 = true;
              if (bVar4) {
                pcVar2 = (this->super_cmCommand).Makefile;
                local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_68,"CMAKE_WARN_DEPRECATED","");
                bVar5 = cmMakefile::IsOn(pcVar2,&local_68);
                pbVar7 = local_48;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p,
                                  CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                           local_68.field_2._M_local_buf[0]) + 1);
                  pbVar7 = local_48;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              t = DEPRECATION_WARNING;
              if (bVar5 == false) goto LAB_00212f25;
            }
            goto LAB_00212e39;
          }
          t = MESSAGE;
          bVar4 = false;
          local_40.Begin._M_current = pbVar1;
        }
        goto LAB_00212be4;
      }
      bVar3 = true;
      t = FATAL_ERROR;
LAB_00212e39:
      local_40.Begin._M_current = pbVar1 + 1;
      bVar4 = false;
    }
    local_40.End._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    delimiter = &local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)delimiter;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_88,&local_40,delimiter->_M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != delimiter) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    if (t == MESSAGE) {
      if (bVar4) {
        cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,&local_88,-1.0);
        pbVar7 = local_48;
      }
      else {
        cmSystemTools::Message(&local_88,(char *)0x0);
        pbVar7 = local_48;
      }
    }
    else {
      this_00 = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
      cmMakefile::GetBacktrace((this->super_cmCommand).Makefile);
      cmMessenger::DisplayMessage(this_00,t,&local_88,(cmListFileBacktrace *)&local_68);
      pbVar7 = local_48;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
      }
    }
    if (bVar3 != false) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_00212f25;
  }
  operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
LAB_00212f25:
  return pbVar1 != pbVar7;
}

Assistant:

bool cmMessageCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string>::const_iterator i = args.begin();

  MessageType type = MessageType::MESSAGE;
  bool status = false;
  bool fatal = false;
  if (*i == "SEND_ERROR") {
    type = MessageType::FATAL_ERROR;
    ++i;
  } else if (*i == "FATAL_ERROR") {
    fatal = true;
    type = MessageType::FATAL_ERROR;
    ++i;
  } else if (*i == "WARNING") {
    type = MessageType::WARNING;
    ++i;
  } else if (*i == "AUTHOR_WARNING") {
    if (this->Makefile->IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
        !this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS")) {
      fatal = true;
      type = MessageType::AUTHOR_ERROR;
    } else if (!this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
      type = MessageType::AUTHOR_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "STATUS") {
    status = true;
    ++i;
  } else if (*i == "DEPRECATION") {
    if (this->Makefile->IsOn("CMAKE_ERROR_DEPRECATED")) {
      fatal = true;
      type = MessageType::DEPRECATION_ERROR;
    } else if ((!this->Makefile->IsSet("CMAKE_WARN_DEPRECATED") ||
                this->Makefile->IsOn("CMAKE_WARN_DEPRECATED"))) {
      type = MessageType::DEPRECATION_WARNING;
    } else {
      return true;
    }
    ++i;
  }

  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());

  if (type != MessageType::MESSAGE) {
    // we've overridden the message type, above, so display it directly
    cmMessenger* m = this->Makefile->GetMessenger();
    m->DisplayMessage(type, message, this->Makefile->GetBacktrace());
  } else {
    if (status) {
      this->Makefile->DisplayStatus(message, -1);
    } else {
      cmSystemTools::Message(message);
    }
  }
  if (fatal) {
    cmSystemTools::SetFatalErrorOccured();
  }
  return true;
}